

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr_tree.cpp
# Opt level: O2

expr_node * __thiscall expr_tree::logDeriv(expr_tree *this,expr_node *node)

{
  expr_node *this_00;
  expr_node *_left;
  expr_node *_right;
  expr_value local_20;
  
  this_00 = (expr_node *)operator_new(0x28);
  expr_value::expr_value(&local_20,4);
  _left = derivative(this,node->right);
  _right = Copy(node->right);
  expr_node::expr_node(this_00,'\x05',&local_20,(expr_node *)0x0,_left,_right);
  Link(this_00,this_00->left,this_00->right);
  return this_00;
}

Assistant:

expr_node* expr_tree::logDeriv(const expr_node* node)
{
    auto deriv = new expr_node(OP, (long)DIV, nullptr, derivative(node->right), Copy(node->right));
    Link(deriv, deriv->left, deriv->right);
    return deriv;
}